

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListListeners
               (ostream *out,
               vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               *descriptions)

{
  size_type this;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *os;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  pointer this_00;
  Column *pCVar4;
  Column *pCVar5;
  ostream *poVar6;
  Column local_138;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Column local_b0;
  Columns local_78;
  reference local_60;
  ListenerDescription *desc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *__range1;
  __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
  local_28;
  size_type local_20;
  size_type maxNameLen;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
  *descriptions_local;
  ostream *out_local;
  
  maxNameLen = (size_type)descriptions;
  descriptions_local =
       (vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)out;
  std::operator<<(out,"Registered listeners:\n");
  bVar1 = std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
          empty((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
                maxNameLen);
  if (!bVar1) {
    cVar2 = std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
            begin((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *
                  )maxNameLen);
    cVar3 = std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
            end((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
                maxNameLen);
    local_28 = std::
               max_element<__gnu_cxx::__normal_iterator<Catch::ListenerDescription_const*,std::vector<Catch::ListenerDescription,std::allocator<Catch::ListenerDescription>>>,Catch::defaultListListeners(std::ostream&,std::vector<Catch::ListenerDescription,std::allocator<Catch::ListenerDescription>>const&)::__0>
                         (cVar2._M_current,cVar3._M_current);
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
              ::operator->(&local_28);
    local_20 = StringRef::size(&this_00->name);
    this = maxNameLen;
    __end1 = std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
             begin((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                    *)maxNameLen);
    desc = (ListenerDescription *)
           std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::end
                     ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                       *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                                       *)&desc), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                 ::operator*(&__end1);
      os = descriptions_local;
      StringRef::operator_cast_to_string(&local_f0,&local_60->name);
      std::operator+(&local_d0,&local_f0,':');
      TextFlow::Column::Column(&local_b0,&local_d0);
      pCVar4 = TextFlow::Column::indent(&local_b0,2);
      pCVar4 = TextFlow::Column::width(pCVar4,local_20 + 5);
      TextFlow::Column::Column(&local_138,&local_60->description);
      pCVar5 = TextFlow::Column::initialIndent(&local_138,0);
      pCVar5 = TextFlow::Column::indent(pCVar5,2);
      pCVar5 = TextFlow::Column::width(pCVar5,0x48 - local_20);
      TextFlow::Column::operator+(&local_78,pCVar4,pCVar5);
      poVar6 = TextFlow::operator<<((ostream *)os,&local_78);
      std::operator<<(poVar6,'\n');
      TextFlow::Columns::~Columns(&local_78);
      TextFlow::Column::~Column(&local_138);
      TextFlow::Column::~Column(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      __gnu_cxx::
      __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
      ::operator++(&__end1);
    }
    poVar6 = std::operator<<((ostream *)descriptions_local,'\n');
    std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void defaultListListeners( std::ostream& out,
                               std::vector<ListenerDescription> const& descriptions ) {
        out << "Registered listeners:\n";

        if(descriptions.empty()) {
            return;
        }

        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ListenerDescription const& lhs,
                                  ListenerDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            out << TextFlow::Column( static_cast<std::string>( desc.name ) +
                                     ':' )
                           .indent( 2 )
                           .width( maxNameLen + 5 ) +
                       TextFlow::Column( desc.description )
                           .initialIndent( 0 )
                           .indent( 2 )
                           .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                << '\n';
        }

        out << '\n' << std::flush;
    }